

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

bool __thiscall mjs::has_octal_escape_sequence(mjs *this,wstring_view s)

{
  uint uVar1;
  long lVar2;
  const_iterator __begin1;
  bool bVar3;
  
  if (this != (mjs *)0x0) {
    lVar2 = 0;
    bVar3 = false;
    do {
      uVar1 = *(uint *)(s._M_len + lVar2);
      if (bVar3) {
        if ((uVar1 & 0xfff8) == 0x30) {
          return true;
        }
        bVar3 = false;
      }
      else {
        bVar3 = uVar1 == 0x5c;
      }
      lVar2 = lVar2 + 4;
    } while ((long)this * 4 != lVar2);
  }
  return false;
}

Assistant:

bool has_octal_escape_sequence(const std::wstring_view s) {
    bool quote = false;
    for (const auto& ch: s) {
        if (quote) {
            if (is_octal_char(ch)) {
                return true;
            }
            quote = false;
        } else if (ch == '\\') {
            quote = true;
        }
    }
    return false;
}